

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTP_Server.cpp
# Opt level: O0

void __thiscall Jupiter::HTTP::Server::Data::Data(Data *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  Data *local_10;
  Data *this_local;
  
  local_10 = this;
  std::
  vector<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>,_std::allocator<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>_>_>
  ::vector(&this->m_hosts);
  std::
  vector<std::unique_ptr<Jupiter::Socket,_std::default_delete<Jupiter::Socket>_>,_std::allocator<std::unique_ptr<Jupiter::Socket,_std::default_delete<Jupiter::Socket>_>_>_>
  ::vector(&this->m_ports);
  std::
  vector<std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>,_std::allocator<std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>_>_>
  ::vector(&this->m_sessions);
  local_30.field_2._12_4_ = 2000;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)&this->session_timeout,
             (int *)(local_30.field_2._M_local_buf + 0xc));
  local_30._M_string_length._0_4_ = 5000;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)&this->keep_alive_session_timeout,
             (int *)&local_30._M_string_length);
  this->max_request_size = 0x2000;
  this->permit_keept_alive = true;
  s_abi_cxx11_(&local_50,"",0);
  std::make_unique<Jupiter::HTTP::Server::Host,std::__cxx11::string>(&local_30);
  std::
  vector<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>,_std::allocator<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>_>_>
  ::push_back(&this->m_hosts,(value_type *)&local_30);
  std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>::
  ~unique_ptr((unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>
               *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

Jupiter::HTTP::Server::Data::Data() {
	// hosts[0] is always the "global" namespace.
	m_hosts.push_back(std::make_unique<Host>(""s));
}